

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor_test.cpp
# Opt level: O0

void __thiscall preprocessor_test_if_Test::TestBody(preprocessor_test_if_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int *in_stack_ffffffffffffff70;
  AssertionResult *this_00;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  char *in_stack_ffffffffffffff80;
  AssertionResult *this_01;
  AssertHelper local_68;
  Message local_60;
  undefined4 local_58;
  undefined4 local_54;
  AssertionResult local_50;
  AssertHelper local_40;
  Message local_38 [3];
  undefined4 local_20;
  undefined4 local_1c;
  AssertionResult local_18;
  
  local_1c = 0;
  local_20 = 0;
  this_01 = &local_18;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (&this_01->success_,in_stack_ffffffffffffff80,
             (int *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
             in_stack_ffffffffffffff70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!bVar1) {
    testing::Message::Message(local_38);
    in_stack_ffffffffffffff80 =
         testing::AssertionResult::failure_message((AssertionResult *)0x110870);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0xb1,in_stack_ffffffffffffff80);
    testing::internal::AssertHelper::operator=(&local_40,local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::Message::~Message((Message *)0x1108be);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x110901);
  local_54 = 0;
  local_58 = 1;
  this_00 = &local_50;
  testing::internal::CmpHelperNE<int,int>
            (&this_01->success_,in_stack_ffffffffffffff80,
             (int *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),(int *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(&local_60);
    message = testing::AssertionResult::failure_message((AssertionResult *)0x110992);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0xb3,message);
    testing::internal::AssertHelper::operator=(&local_68,&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::Message::~Message((Message *)0x1109de);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x110a1e);
  return;
}

Assistant:

TEST_F(preprocessor_test, if)
{
	EXPECT_EQ((int)0, PREPROCESSOR_IF(1, (int)0, (int)1));

	EXPECT_NE((int)0, PREPROCESSOR_IF(0, (int)0, (int)1));
}